

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u32 pager_cksum(Pager *pPager,u8 *aData)

{
  u32 uVar1;
  ulong uVar2;
  
  uVar1 = pPager->cksumInit;
  for (uVar2 = (ulong)(uint)pPager->pageSize; 200 < (int)uVar2; uVar2 = uVar2 - 200) {
    uVar1 = uVar1 + aData[uVar2 - 200];
  }
  return uVar1;
}

Assistant:

static u32 pager_cksum(Pager *pPager, const u8 *aData){
  u32 cksum = pPager->cksumInit;         /* Checksum value to return */
  int i = pPager->pageSize-200;          /* Loop counter */
  while( i>0 ){
    cksum += aData[i];
    i -= 200;
  }
  return cksum;
}